

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::PackageExportAllDeclarationSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,PackageExportAllDeclarationSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (PackageExportAllDeclarationSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (PackageExportAllDeclarationSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 5;
    break;
  case (PackageExportAllDeclarationSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (PackageExportAllDeclarationSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (PackageExportAllDeclarationSyntax *)0x4:
    pPVar1 = __return_storage_ptr__ + 8;
    break;
  case (PackageExportAllDeclarationSyntax *)0x5:
    pPVar1 = __return_storage_ptr__ + 9;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax PackageExportAllDeclarationSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &keyword;
        case 2: return &star1;
        case 3: return &doubleColon;
        case 4: return &star2;
        case 5: return &semi;
        default: return nullptr;
    }
}